

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injected.h
# Opt level: O0

ptr_type * __thiscall inject::context<0>::injected<service>::ptr(injected<service> *this)

{
  element_type *peVar1;
  undefined1 local_20 [24];
  injected<service> *this_local;
  
  local_20._16_8_ = this;
  peVar1 = boost::shared_ptr<service>::get(&this->_ptr);
  if (peVar1 == (element_type *)0x0) {
    get_current();
    instance<service>((context<0> *)local_20);
    boost::shared_ptr<service>::operator=(&this->_ptr,(shared_ptr<service> *)local_20);
    boost::shared_ptr<service>::~shared_ptr((shared_ptr<service> *)local_20);
  }
  return &this->_ptr;
}

Assistant:

const ptr_type& ptr() const {
      if (_ptr.get() == 0) {
        *const_cast<ptr_type*>(&_ptr) =
          context<ID>::get_current().template instance<T>();
      }
      return _ptr;
    }